

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3BitState(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  Prog *this;
  ostream *poVar2;
  StringPiece *local_540;
  LogMessage local_518;
  undefined1 local_398 [8];
  StringPiece sp [4];
  Prog *prog;
  LogMessage local_1c0;
  StringPiece local_40;
  Regexp *local_30;
  Regexp *re;
  StringPiece *pSStack_20;
  int i;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  pSStack_20 = text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  for (re._4_4_ = 0; re._4_4_ < regexp_local._4_4_; re._4_4_ = re._4_4_ + 1) {
    StringPiece::StringPiece(&local_40,(char *)text_local);
    local_30 = Regexp::Parse(&local_40,LikePerl,(RegexpStatus *)0x0);
    if (local_30 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x437);
      poVar2 = LogMessage::stream(&local_1c0);
      std::operator<<(poVar2,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c0);
    }
    this = Regexp::CompileToProg(local_30,0);
    if (this == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sp[3].length_,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x439);
      poVar2 = LogMessage::stream((LogMessage *)&sp[3].length_);
      std::operator<<(poVar2,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp[3].length_);
    }
    local_540 = (StringPiece *)local_398;
    do {
      StringPiece::StringPiece(local_540);
      local_540 = local_540 + 1;
    } while (local_540 != (StringPiece *)&sp[3].length_);
    bVar1 = Prog::SearchBitState
                      (this,pSStack_20,pSStack_20,kAnchored,kFullMatch,(StringPiece *)local_398,4);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_518,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x43b);
      poVar2 = LogMessage::stream(&local_518);
      std::operator<<(poVar2,
                      "Check failed: prog->SearchBitState(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_518);
    }
    if (this != (Prog *)0x0) {
      Prog::~Prog(this);
      operator_delete(this);
    }
    Regexp::Decref(local_30);
  }
  return;
}

Assistant:

void Parse3BitState(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    StringPiece sp[4];  // 4 because sp[0] is whole match.
    CHECK(prog->SearchBitState(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
    delete prog;
    re->Decref();
  }
}